

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void ft_glyphslot_preset_bitmap(FT_GlyphSlot slot,FT_Render_Mode mode,FT_Vector *origin)

{
  short sVar1;
  FT_Vector *pFVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uchar uVar11;
  long lVar12;
  ulong uVar13;
  FT_Pos FVar14;
  long lVar15;
  FT_Vector *pFVar16;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  long local_20;
  
  if ((slot->internal != (FT_Slot_Internal)0x0) && ((slot->internal->flags & 1) != 0)) {
    return;
  }
  if (origin == (FT_Vector *)0x0) {
    local_20 = 0;
    lVar8 = 0;
  }
  else {
    lVar8 = origin->x;
    local_20 = origin->y;
  }
  sVar1 = (slot->outline).n_points;
  if ((long)sVar1 == 0) {
    lVar10 = 0;
    FVar14 = 0;
    lVar12 = 0;
    lVar15 = 0;
  }
  else {
    pFVar2 = (slot->outline).points;
    FVar14 = pFVar2->x;
    lVar10 = pFVar2->y;
    lVar12 = lVar10;
    lVar15 = FVar14;
    if (1 < sVar1) {
      pFVar16 = pFVar2 + 1;
      do {
        lVar3 = pFVar16->x;
        if (lVar3 < FVar14) {
          FVar14 = lVar3;
        }
        lVar4 = pFVar16->y;
        if (lVar15 < lVar3) {
          lVar15 = lVar3;
        }
        if (lVar4 < lVar10) {
          lVar10 = lVar4;
        }
        if (lVar12 < lVar4) {
          lVar12 = lVar4;
        }
        pFVar16 = pFVar16 + 1;
      } while (pFVar16 < pFVar2 + sVar1);
    }
  }
  local_38 = FVar14 + lVar8;
  local_30 = lVar10 + local_20;
  local_28 = lVar8 + lVar15;
  local_20 = local_20 + lVar12;
  if (mode == FT_RENDER_MODE_LCD_V) {
    ft_lcd_padding((FT_Pos *)&local_30,&local_20,slot);
    uVar11 = '\x06';
  }
  else if (mode == FT_RENDER_MODE_LCD) {
    ft_lcd_padding((FT_Pos *)&local_38,(FT_Pos *)&local_28,slot);
    uVar11 = '\x05';
  }
  else {
    uVar11 = '\x02';
    if (mode == FT_RENDER_MODE_MONO) {
      uVar9 = local_28 + 0x3f;
      if (0x3f < lVar15 - FVar14) {
        uVar9 = local_28 + 0x20;
        local_38 = local_38 + 0x20;
      }
      if (lVar12 - lVar10 < 0x40) {
        uVar6 = local_20 + 0x3f;
      }
      else {
        local_30 = local_30 + 0x20;
        uVar6 = local_20 + 0x20;
      }
      uVar11 = '\x01';
      uVar5 = local_38;
      goto LAB_00132c3d;
    }
  }
  uVar9 = local_28 + 0x3f;
  uVar6 = local_20 + 0x3f;
  uVar5 = local_38;
LAB_00132c3d:
  local_28 = uVar9 & 0xffffffffffffffc0;
  local_30 = local_30 & 0xffffffffffffffc0;
  local_38 = uVar5 & 0xffffffffffffffc0;
  uVar9 = local_28 - local_38 >> 6;
  uVar7 = (uint)((uVar6 & 0xffffffffffffffc0) - local_30 >> 6);
  uVar13 = uVar9;
  if (uVar11 == '\x06') {
    uVar7 = uVar7 * 3;
  }
  else if (uVar11 == '\x05') {
    lVar8 = uVar9 * 3;
    uVar9 = uVar9 * 3;
    uVar13 = lVar8 + 3U & 0xfffffffffffffffc;
  }
  else if (uVar11 == '\x01') {
    uVar13 = uVar9 + 0xf >> 3 & 0xfffffffffffffffe;
  }
  slot->bitmap_left = (FT_Int)(uVar5 >> 6);
  slot->bitmap_top = (FT_Int)(uVar6 >> 6);
  (slot->bitmap).pixel_mode = uVar11;
  (slot->bitmap).num_grays = 0x100;
  (slot->bitmap).width = (uint)uVar9;
  (slot->bitmap).rows = uVar7;
  (slot->bitmap).pitch = (int)uVar13;
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_preset_bitmap( FT_GlyphSlot      slot,
                              FT_Render_Mode    mode,
                              const FT_Vector*  origin )
  {
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;

    FT_Pixel_Mode  pixel_mode;

    FT_BBox  cbox;
    FT_Pos   x_shift = 0;
    FT_Pos   y_shift = 0;
    FT_Pos   x_left, y_top;
    FT_Pos   width, height, pitch;


    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
      return;

    if ( origin )
    {
      x_shift = origin->x;
      y_shift = origin->y;
    }

    /* compute the control box, and grid-fit it, */
    /* taking into account the origin shift      */
    FT_Outline_Get_CBox( outline, &cbox );

    cbox.xMin += x_shift;
    cbox.yMin += y_shift;
    cbox.xMax += x_shift;
    cbox.yMax += y_shift;

    switch ( mode )
    {
    case FT_RENDER_MODE_MONO:
      pixel_mode = FT_PIXEL_MODE_MONO;
#if 1
      /* undocumented but confirmed: bbox values get rounded    */
      /* unless the rounded box can collapse for a narrow glyph */
      if ( cbox.xMax - cbox.xMin < 64 )
      {
        cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
        cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      }
      else
      {
        cbox.xMin = FT_PIX_ROUND_LONG( cbox.xMin );
        cbox.xMax = FT_PIX_ROUND_LONG( cbox.xMax );
      }

      if ( cbox.yMax - cbox.yMin < 64 )
      {
        cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
        cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
      }
      else
      {
        cbox.yMin = FT_PIX_ROUND_LONG( cbox.yMin );
        cbox.yMax = FT_PIX_ROUND_LONG( cbox.yMax );
      }
#else
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
#endif
      break;

    case FT_RENDER_MODE_LCD:
      pixel_mode = FT_PIXEL_MODE_LCD;
      ft_lcd_padding( &cbox.xMin, &cbox.xMax, slot );
      goto Round;

    case FT_RENDER_MODE_LCD_V:
      pixel_mode = FT_PIXEL_MODE_LCD_V;
      ft_lcd_padding( &cbox.yMin, &cbox.yMax, slot );
      goto Round;

    case FT_RENDER_MODE_NORMAL:
    case FT_RENDER_MODE_LIGHT:
    default:
      pixel_mode = FT_PIXEL_MODE_GRAY;
    Round:
      cbox.xMin = FT_PIX_FLOOR( cbox.xMin );
      cbox.yMin = FT_PIX_FLOOR( cbox.yMin );
      cbox.xMax = FT_PIX_CEIL_LONG( cbox.xMax );
      cbox.yMax = FT_PIX_CEIL_LONG( cbox.yMax );
    }

    x_shift = SUB_LONG( x_shift, cbox.xMin );
    y_shift = SUB_LONG( y_shift, cbox.yMin );

    x_left = cbox.xMin >> 6;
    y_top  = cbox.yMax >> 6;

    width  = ( (FT_ULong)cbox.xMax - (FT_ULong)cbox.xMin ) >> 6;
    height = ( (FT_ULong)cbox.yMax - (FT_ULong)cbox.yMin ) >> 6;

    switch ( pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      pitch = ( ( width + 15 ) >> 4 ) << 1;
      break;

    case FT_PIXEL_MODE_LCD:
      width *= 3;
      pitch  = FT_PAD_CEIL( width, 4 );
      break;

    case FT_PIXEL_MODE_LCD_V:
      height *= 3;
      /* fall through */

    case FT_PIXEL_MODE_GRAY:
    default:
      pitch = width;
    }

    slot->bitmap_left = (FT_Int)x_left;
    slot->bitmap_top  = (FT_Int)y_top;

    bitmap->pixel_mode = (unsigned char)pixel_mode;
    bitmap->num_grays  = 256;
    bitmap->width      = (unsigned int)width;
    bitmap->rows       = (unsigned int)height;
    bitmap->pitch      = pitch;
  }